

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids::IfcArbitraryProfileDefWithVoids
          (IfcArbitraryProfileDefWithVoids *this)

{
  IfcArbitraryProfileDefWithVoids *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x98,"IfcArbitraryProfileDefWithVoids");
  IfcArbitraryClosedProfileDef::IfcArbitraryClosedProfileDef
            (&this->super_IfcArbitraryClosedProfileDef,&PTR_construction_vtable_24__00f9b820);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids,_1UL> *)
             &(this->super_IfcArbitraryClosedProfileDef).field_0x70,
             &PTR_construction_vtable_24__00f9b868);
  (this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf9b790;
  *(undefined8 *)&this->field_0x98 = 0xf9b808;
  *(undefined8 *)&(this->super_IfcArbitraryClosedProfileDef).super_IfcProfileDef.field_0x58 =
       0xf9b7b8;
  *(undefined8 *)&(this->super_IfcArbitraryClosedProfileDef).field_0x70 = 0xf9b7e0;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_1UL,_0UL> *)
             &(this->super_IfcArbitraryClosedProfileDef).field_0x80);
  return;
}

Assistant:

IfcArbitraryProfileDefWithVoids() : Object("IfcArbitraryProfileDefWithVoids") {}